

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O3

void ym2612_update_chan<2>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  uint local_cc;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_60;
  
  local_d4 = ch->SLOT[3].Ecnt;
  if (local_d4 != 0x20000000) {
    iVar1 = g->LFOinc;
    iVar15 = ch->SLOT[3].Fcnt;
    iVar11 = ch->SLOT[1].Fcnt;
    uVar22 = ch->SLOT[2].Fcnt;
    iVar21 = ch->SLOT[0].Fcnt;
    local_d0 = ch->SLOT[0].Ecnt;
    local_d8 = ch->SLOT[2].Ecnt;
    local_dc = ch->SLOT[1].Ecnt;
    local_7c = ch->SLOT[0].Ecmp;
    local_78 = ch->SLOT[0].Einc;
    local_80 = ch->SLOT[1].Ecmp;
    uVar16 = g->LFOcnt;
    local_84 = ch->SLOT[1].Einc;
    local_90 = ch->SLOT[2].Ecmp;
    local_88 = ch->SLOT[2].Einc;
    local_94 = ch->SLOT[3].Ecmp;
    local_8c = ch->SLOT[3].Einc;
    local_a8 = ch->SLOT[0].env_xor;
    local_98 = ch->SLOT[0].env_max;
    local_ac = ch->SLOT[2].env_xor;
    local_9c = ch->SLOT[2].env_max;
    local_b0 = ch->SLOT[1].env_xor;
    local_a0 = ch->SLOT[1].env_max;
    local_b4 = ch->SLOT[3].env_xor;
    local_a4 = ch->SLOT[3].env_max;
    local_74 = ch->SLOT[0].Ecurp;
    local_cc = ch->SLOT[0].SEG;
    iVar17 = ch->SLOT[1].Ecurp;
    local_b8 = ch->SLOT[1].SEG;
    iVar13 = ch->SLOT[2].Ecurp;
    local_bc = ch->SLOT[2].SEG;
    iVar12 = ch->SLOT[3].Ecurp;
    local_c0 = ch->SLOT[3].SEG;
    iVar2 = ch->SLOT[3].TLL;
    iVar3 = ch->SLOT[3].AMS;
    iVar4 = ch->FB;
    lVar19 = 0;
    iVar23 = ch->S0_OUT[1];
    iVar5 = ch->S0_OUT[0];
    do {
      local_60 = iVar5;
      uVar16 = uVar16 + iVar1;
      uVar18 = (ulong)(uVar16 >> 0x11 & 0x7fe);
      iVar20 = (int)*(short *)((long)g->LFO_ENV_TAB + uVar18);
      uVar9 = (int)g->ENV_TAB[local_d0 >> 0x10] + ch->SLOT[0].TLL;
      iVar5 = (iVar20 >> ((byte)ch->SLOT[0].AMS & 0x1f)) + (uVar9 ^ local_a8);
      if (local_98 <= (int)uVar9) {
        iVar5 = 0;
      }
      uVar9 = (int)g->ENV_TAB[local_d8 >> 0x10] + ch->SLOT[2].TLL;
      iVar6 = (iVar20 >> ((byte)ch->SLOT[2].AMS & 0x1f)) + (uVar9 ^ local_ac);
      if (local_9c <= (int)uVar9) {
        iVar6 = 0;
      }
      uVar9 = (int)g->ENV_TAB[local_dc >> 0x10] + ch->SLOT[1].TLL;
      iVar7 = (iVar20 >> ((byte)ch->SLOT[1].AMS & 0x1f)) + (uVar9 ^ local_b0);
      if (local_a0 <= (int)uVar9) {
        iVar7 = 0;
      }
      uVar9 = g->ENV_TAB[local_d4 >> 0x10] + iVar2;
      iVar20 = (iVar20 >> ((byte)iVar3 & 0x1f)) + (uVar9 ^ local_b4);
      if (local_a4 <= (int)uVar9) {
        iVar20 = 0;
      }
      iVar5 = g->TL_TAB[(long)iVar5 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)((iVar23 + local_60 >> ((byte)iVar4 & 0x1f)) +
                                                      iVar21) >> 0xd & 0x1ffe))];
      iVar10 = (int)*(short *)((long)g->TL_TAB +
                              ((long)iVar20 +
                              (long)*(short *)((long)g->SIN_TAB +
                                              (ulong)((uint)(local_60 + iVar15 +
                                                            g->TL_TAB[(long)iVar7 +
                                                                      (long)*(short *)((long)g->
                                                  SIN_TAB + (ulong)((uint)(g->TL_TAB[(long)iVar6 +
                                                                                     (long)*(short *
                                                  )((long)g->SIN_TAB +
                                                   (ulong)(uVar22 >> 0xd & 0x1ffe))] + iVar11) >>
                                                  0xd & 0x1ffe))]) >> 0xd & 0x1ffe))) * 4 + 2);
      iVar14 = ((int)*(short *)((long)g->LFO_FREQ_TAB + uVar18) * ch->FMS >> 10) + 0x100;
      iVar23 = ch->SLOT[0].Finc;
      iVar20 = ch->SLOT[2].Finc;
      iVar6 = ch->SLOT[1].Finc;
      iVar7 = ch->SLOT[3].Finc;
      uVar18._0_4_ = ch->LEFT;
      uVar18._4_4_ = ch->RIGHT;
      uVar8 = *(undefined4 *)(buf + lVar19 * 2);
      local_d0 = local_d0 + local_78;
      ch->SLOT[0].Ecnt = local_d0;
      if (local_d0 < local_7c) goto switchD_006ee5b3_default;
      switch(local_74) {
      case 0:
        local_7c = ch->SLOT[0].SLL;
        local_78 = ch->SLOT[0].EincD;
        ch->SLOT[0].Einc = local_78;
        ch->SLOT[0].Ecmp = local_7c;
        ch->SLOT[0].Ecurp = 1;
        ch->SLOT[0].Ecnt = 0x10000000;
        local_d0 = 0x10000000;
        local_74 = 1;
        break;
      case 1:
        local_d0 = ch->SLOT[0].SLL;
        local_78 = ch->SLOT[0].EincS;
        ch->SLOT[0].Ecnt = local_d0;
        ch->SLOT[0].Einc = local_78;
        ch->SLOT[0].Ecmp = 0x20000000;
        ch->SLOT[0].Ecurp = 2;
        local_7c = 0x20000000;
        local_74 = 2;
        break;
      case 2:
        if ((local_cc & 8) == 0) goto switchD_006ee5b3_caseD_3;
        if ((local_cc & 1) == 0) {
          local_78 = ch->SLOT[0].EincA;
          ch->SLOT[0].Einc = local_78;
          ch->SLOT[0].Ecmp = 0x10000000;
          ch->SLOT[0].Ecurp = 0;
          ch->SLOT[0].Ecnt = 0;
          local_74 = 0;
          ch->SLOT[0].env_xor = 0;
          ch->SLOT[0].env_max = 0x7fffffff;
          local_7c = 0x10000000;
          local_98 = 0x7fffffff;
          local_cc = local_cc * 2 & 4;
          ch->SLOT[0].SEG = local_cc;
          if (local_cc == 0) {
            local_cc = 0;
            local_a8 = 0;
          }
          else {
            ch->SLOT[0].env_xor = 0xfff;
            ch->SLOT[0].env_max = 0xfff;
            local_98 = 0xfff;
            local_a8 = 0xfff;
          }
          local_d0 = 0;
          break;
        }
        ch->SLOT[0].env_xor = 0;
        ch->SLOT[0].env_max = 0x7fffffff;
        local_cc = local_cc * 2 & 4;
        ch->SLOT[0].SEG = local_cc;
        if (local_cc == 0) {
          local_cc = 0;
          local_98 = 0x7fffffff;
          local_a8 = 0;
        }
        else {
          ch->SLOT[0].env_xor = 0xfff;
          ch->SLOT[0].env_max = 0xfff;
          local_98 = 0xfff;
          local_a8 = 0xfff;
        }
        goto LAB_006ee604;
      case 3:
switchD_006ee5b3_caseD_3:
LAB_006ee604:
        ch->SLOT[0].Ecnt = 0x20000000;
        ch->SLOT[0].Einc = 0;
        ch->SLOT[0].Ecmp = 0x20000001;
        local_d0 = 0x20000000;
        local_7c = 0x20000001;
        local_78 = 0;
      }
switchD_006ee5b3_default:
      local_dc = local_dc + local_84;
      ch->SLOT[1].Ecnt = local_dc;
      if (local_dc < local_80) goto switchD_006ee6b3_default;
      switch(iVar17) {
      case 0:
        local_80 = ch->SLOT[1].SLL;
        local_84 = ch->SLOT[1].EincD;
        ch->SLOT[1].Einc = local_84;
        ch->SLOT[1].Ecmp = local_80;
        ch->SLOT[1].Ecurp = 1;
        ch->SLOT[1].Ecnt = 0x10000000;
        local_dc = 0x10000000;
        iVar17 = 1;
        break;
      case 1:
        local_dc = ch->SLOT[1].SLL;
        local_84 = ch->SLOT[1].EincS;
        ch->SLOT[1].Ecnt = local_dc;
        ch->SLOT[1].Einc = local_84;
        ch->SLOT[1].Ecmp = 0x20000000;
        ch->SLOT[1].Ecurp = 2;
        local_80 = 0x20000000;
        iVar17 = 2;
        break;
      case 2:
        if ((local_b8 & 8) == 0) goto switchD_006ee6b3_caseD_3;
        if ((local_b8 & 1) == 0) {
          local_84 = ch->SLOT[1].EincA;
          ch->SLOT[1].Einc = local_84;
          ch->SLOT[1].Ecmp = 0x10000000;
          ch->SLOT[1].Ecurp = 0;
          ch->SLOT[1].Ecnt = 0;
          ch->SLOT[1].env_xor = 0;
          ch->SLOT[1].env_max = 0x7fffffff;
          local_80 = 0x10000000;
          local_a0 = 0x7fffffff;
          local_b8 = local_b8 * 2 & 4;
          ch->SLOT[1].SEG = local_b8;
          if (local_b8 == 0) {
            local_b8 = 0;
            local_b0 = 0;
          }
          else {
            ch->SLOT[1].env_xor = 0xfff;
            ch->SLOT[1].env_max = 0xfff;
            local_a0 = 0xfff;
            local_b0 = 0xfff;
          }
          iVar17 = 0;
          local_dc = 0;
          break;
        }
        ch->SLOT[1].env_xor = 0;
        ch->SLOT[1].env_max = 0x7fffffff;
        local_b8 = local_b8 * 2 & 4;
        ch->SLOT[1].SEG = local_b8;
        if (local_b8 == 0) {
          local_b8 = 0;
          local_a0 = 0x7fffffff;
          local_b0 = 0;
        }
        else {
          ch->SLOT[1].env_xor = 0xfff;
          ch->SLOT[1].env_max = 0xfff;
          local_a0 = 0xfff;
          local_b0 = 0xfff;
        }
        goto LAB_006ee708;
      case 3:
switchD_006ee6b3_caseD_3:
LAB_006ee708:
        ch->SLOT[1].Ecnt = 0x20000000;
        ch->SLOT[1].Einc = 0;
        ch->SLOT[1].Ecmp = 0x20000001;
        local_dc = 0x20000000;
        local_80 = 0x20000001;
        local_84 = 0;
      }
switchD_006ee6b3_default:
      local_d8 = local_d8 + local_88;
      ch->SLOT[2].Ecnt = local_d8;
      if (local_d8 < local_90) goto switchD_006ee7c6_default;
      switch(iVar13) {
      case 0:
        local_90 = ch->SLOT[2].SLL;
        local_88 = ch->SLOT[2].EincD;
        ch->SLOT[2].Einc = local_88;
        ch->SLOT[2].Ecmp = local_90;
        ch->SLOT[2].Ecurp = 1;
        ch->SLOT[2].Ecnt = 0x10000000;
        local_d8 = 0x10000000;
        iVar13 = 1;
        break;
      case 1:
        local_d8 = ch->SLOT[2].SLL;
        local_88 = ch->SLOT[2].EincS;
        ch->SLOT[2].Ecnt = local_d8;
        ch->SLOT[2].Einc = local_88;
        ch->SLOT[2].Ecmp = 0x20000000;
        ch->SLOT[2].Ecurp = 2;
        local_90 = 0x20000000;
        iVar13 = 2;
        break;
      case 2:
        if ((local_bc & 8) == 0) goto switchD_006ee7c6_caseD_3;
        if ((local_bc & 1) == 0) {
          local_88 = ch->SLOT[2].EincA;
          ch->SLOT[2].Einc = local_88;
          ch->SLOT[2].Ecmp = 0x10000000;
          ch->SLOT[2].Ecurp = 0;
          ch->SLOT[2].Ecnt = 0;
          ch->SLOT[2].env_xor = 0;
          ch->SLOT[2].env_max = 0x7fffffff;
          local_90 = 0x10000000;
          local_9c = 0x7fffffff;
          local_bc = local_bc * 2 & 4;
          ch->SLOT[2].SEG = local_bc;
          if (local_bc == 0) {
            local_bc = 0;
            local_ac = 0;
          }
          else {
            ch->SLOT[2].env_xor = 0xfff;
            ch->SLOT[2].env_max = 0xfff;
            local_9c = 0xfff;
            local_ac = 0xfff;
          }
          local_d8 = 0;
          iVar13 = 0;
          break;
        }
        ch->SLOT[2].env_xor = 0;
        ch->SLOT[2].env_max = 0x7fffffff;
        local_bc = local_bc * 2 & 4;
        ch->SLOT[2].SEG = local_bc;
        if (local_bc == 0) {
          local_bc = 0;
          local_9c = 0x7fffffff;
          local_ac = 0;
        }
        else {
          ch->SLOT[2].env_xor = 0xfff;
          ch->SLOT[2].env_max = 0xfff;
          local_9c = 0xfff;
          local_ac = 0xfff;
        }
        goto LAB_006ee81c;
      case 3:
switchD_006ee7c6_caseD_3:
LAB_006ee81c:
        ch->SLOT[2].Ecnt = 0x20000000;
        ch->SLOT[2].Einc = 0;
        ch->SLOT[2].Ecmp = 0x20000001;
        local_d8 = 0x20000000;
        local_90 = 0x20000001;
        local_88 = 0;
      }
switchD_006ee7c6_default:
      local_d4 = local_d4 + local_8c;
      ch->SLOT[3].Ecnt = local_d4;
      if (local_94 <= local_d4) {
        switch(iVar12) {
        case 0:
          local_94 = ch->SLOT[3].SLL;
          local_8c = ch->SLOT[3].EincD;
          ch->SLOT[3].Einc = local_8c;
          ch->SLOT[3].Ecmp = local_94;
          ch->SLOT[3].Ecurp = 1;
          ch->SLOT[3].Ecnt = 0x10000000;
          local_d4 = 0x10000000;
          iVar12 = 1;
          break;
        case 1:
          local_d4 = ch->SLOT[3].SLL;
          local_8c = ch->SLOT[3].EincS;
          ch->SLOT[3].Ecnt = local_d4;
          ch->SLOT[3].Einc = local_8c;
          ch->SLOT[3].Ecmp = 0x20000000;
          ch->SLOT[3].Ecurp = 2;
          local_94 = 0x20000000;
          iVar12 = 2;
          break;
        case 2:
          if ((local_c0 & 8) != 0) {
            if ((local_c0 & 1) == 0) {
              local_8c = ch->SLOT[3].EincA;
              ch->SLOT[3].Einc = local_8c;
              ch->SLOT[3].Ecmp = 0x10000000;
              ch->SLOT[3].Ecurp = 0;
              ch->SLOT[3].Ecnt = 0;
              ch->SLOT[3].env_xor = 0;
              ch->SLOT[3].env_max = 0x7fffffff;
              local_94 = 0x10000000;
              local_a4 = 0x7fffffff;
              local_c0 = local_c0 * 2 & 4;
              ch->SLOT[3].SEG = local_c0;
              if (local_c0 == 0) {
                local_c0 = 0;
                local_b4 = 0;
              }
              else {
                ch->SLOT[3].env_xor = 0xfff;
                ch->SLOT[3].env_max = 0xfff;
                local_a4 = 0xfff;
                local_b4 = 0xfff;
              }
              local_d4 = 0;
              iVar12 = 0;
              break;
            }
            ch->SLOT[3].env_xor = 0;
            ch->SLOT[3].env_max = 0x7fffffff;
            local_c0 = local_c0 * 2 & 4;
            ch->SLOT[3].SEG = local_c0;
            if (local_c0 == 0) {
              local_c0 = 0;
              local_a4 = 0x7fffffff;
              local_b4 = 0;
            }
            else {
              ch->SLOT[3].env_xor = 0xfff;
              ch->SLOT[3].env_max = 0xfff;
              local_a4 = 0xfff;
              local_b4 = 0xfff;
            }
          }
        case 3:
          ch->SLOT[3].Ecnt = 0x20000000;
          ch->SLOT[3].Einc = 0;
          ch->SLOT[3].Ecmp = 0x20000001;
          local_d4 = 0x20000000;
          local_94 = 0x20000001;
          local_8c = 0;
        }
      }
      iVar21 = ((uint)(iVar23 * iVar14) >> 8) + iVar21;
      uVar22 = ((uint)(iVar20 * iVar14) >> 8) + uVar22;
      iVar11 = ((uint)(iVar6 * iVar14) >> 8) + iVar11;
      iVar15 = ((uint)(iVar14 * iVar7) >> 8) + iVar15;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar18 & CONCAT44(iVar10,iVar10);
      ch->S0_OUT[0] = iVar5;
      auVar24 = pshuflw(auVar24,auVar24,0xe8);
      *(uint *)(buf + lVar19 * 2) =
           CONCAT22((short)((uint)uVar8 >> 0x10) + auVar24._2_2_,(short)uVar8 + auVar24._0_2_);
      lVar19 = lVar19 + 1;
      iVar23 = local_60;
    } while (length != (int)lVar19);
    ch->S0_OUT[1] = local_60;
    ch->SLOT[0].Fcnt = iVar21;
    ch->SLOT[2].Fcnt = uVar22;
    ch->SLOT[1].Fcnt = iVar11;
    ch->SLOT[3].Fcnt = iVar15;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}